

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHG.cxx
# Opt level: O3

bool __thiscall cmCTestHG::StatusParser::ProcessLine(StatusParser *this)

{
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  undefined1 *local_58;
  long local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  byte *local_38;
  undefined8 local_30;
  byte local_28;
  undefined7 uStack_27;
  
  bVar2 = cmsys::RegularExpression::find
                    (&this->RegexStatus,(this->super_LineParser).Line._M_dataplus._M_p,
                     &(this->RegexStatus).regmatch);
  if (bVar2) {
    pcVar1 = (this->RegexStatus).regmatch.startp[1];
    if (pcVar1 == (char *)0x0) {
      local_38 = &local_28;
      local_30 = 0;
      local_28 = 0;
      bVar3 = 0;
    }
    else {
      local_38 = &local_28;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,pcVar1,(this->RegexStatus).regmatch.endp[1]);
      bVar3 = *local_38;
    }
    pcVar1 = (this->RegexStatus).regmatch.startp[2];
    if (pcVar1 == (char *)0x0) {
      local_58 = &local_48;
      local_50 = 0;
      local_48 = 0;
    }
    else {
      local_58 = &local_48;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,pcVar1,(this->RegexStatus).regmatch.endp[2]);
      if (((local_50 != 0) && (bVar3 - 0x21 < 0x32)) &&
         ((0x2100100000001U >> ((ulong)(bVar3 - 0x21) & 0x3f) & 1) != 0)) {
        (*(this->HG->super_cmCTestGlobalVC).super_cmCTestVC._vptr_cmCTestVC[10])
                  (this->HG,1,&local_58);
      }
    }
    if (local_58 != &local_48) {
      operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
    }
    if (local_38 != &local_28) {
      operator_delete(local_38,CONCAT71(uStack_27,local_28) + 1);
    }
  }
  return true;
}

Assistant:

bool ProcessLine() override
  {
    if (this->RegexStatus.find(this->Line)) {
      this->DoPath(this->RegexStatus.match(1)[0], this->RegexStatus.match(2));
    }
    return true;
  }